

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasStringPieceFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  Descriptor *pDVar3;
  bool bVar4;
  int index;
  Options *pOVar5;
  uint index_00;
  
  if (0 < *(int *)(descriptor + 4)) {
    index = 0;
    do {
      pFVar2 = Descriptor::field(descriptor,index);
      if (*(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar2[2] * 4) == 9) {
        google::protobuf::FieldDescriptor::cpp_string_type();
      }
      index = index + 1;
    } while (index < *(int *)(descriptor + 4));
  }
  bVar4 = 0 < *(int *)(descriptor + 0x80);
  if (0 < *(int *)(descriptor + 0x80)) {
    pOVar5 = (Options *)0x0;
    pDVar3 = Descriptor::nested_type(descriptor,0);
    bVar1 = HasStringPieceFields(pDVar3,pOVar5);
    if (!bVar1) {
      index_00 = 1;
      do {
        bVar4 = (int)index_00 < *(int *)(descriptor + 0x80);
        if (*(int *)(descriptor + 0x80) <= (int)index_00) {
          return bVar4;
        }
        pOVar5 = (Options *)(ulong)index_00;
        pDVar3 = Descriptor::nested_type(descriptor,index_00);
        bVar1 = HasStringPieceFields(pDVar3,pOVar5);
        index_00 = index_00 + 1;
      } while (!bVar1);
    }
  }
  return bVar4;
}

Assistant:

static bool HasStringPieceFields(const Descriptor* descriptor,
                                 const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsStringPieceField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasStringPieceFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}